

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void chunk(LexState *ls)

{
  unsigned_short *puVar1;
  FuncState *pFVar2;
  Instruction *pIVar3;
  LocVar *pLVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int nexps;
  uint uVar9;
  TString *pTVar10;
  TString *pTVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  FuncState *pFVar16;
  expdesc e;
  expdesc b;
  LHS_assign local_70;
  LHS_assign *local_50;
  anon_union_8_2_fd02c123_for_u local_48 [2];
  FuncState *local_38;
  
  uVar13 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar13;
  if (200 < (uVar13 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  do {
    iVar6 = (ls->t).token;
    if ((iVar6 - 0x104U < 0x1c) && ((0x8010007U >> (iVar6 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x13 < iVar6 - 0x102U) {
switchD_00110277_caseD_104:
      pFVar2 = ls->fs;
      primaryexp(ls,&local_70.v);
      if (local_70.v.k == VCALL) {
        pIVar3 = pFVar2->f->code;
        pIVar3[local_70.v.u.s.info] = pIVar3[local_70.v.u.s.info] & 0xff803fff | 0x4000;
      }
      else {
        local_70.prev = (LHS_assign *)0x0;
        assignment(ls,&local_70,1);
      }
      goto LAB_00110acc;
    }
    iVar15 = ls->linenumber;
    switch(iVar6) {
    case 0x102:
      luaX_next(ls);
      breakstat(ls);
      goto LAB_001105e9;
    case 0x103:
      luaX_next(ls);
      block(ls);
      check_match(ls,0x106,0x103,iVar15);
      break;
    default:
      goto switchD_00110277_caseD_104;
    case 0x108:
      pFVar2 = ls->fs;
      local_48[0].s.info = -1;
      local_48[0]._4_1_ = pFVar2->nactvar;
      local_48[0]._5_1_ = '\0';
      local_48[0]._6_1_ = '\x01';
      local_50 = (LHS_assign *)pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_50;
      luaX_next(ls);
      pTVar11 = str_checkname(ls);
      iVar6 = (ls->t).token;
      if ((iVar6 == 0x2c) || (iVar6 == 0x10b)) {
        local_38 = ls->fs;
        iVar6 = local_38->freereg;
        pTVar10 = luaX_newstring(ls,"(for generator)",0xf);
        new_localvar(ls,pTVar10,0);
        pTVar10 = luaX_newstring(ls,"(for state)",0xb);
        iVar7 = 1;
        new_localvar(ls,pTVar10,1);
        pTVar10 = luaX_newstring(ls,"(for control)",0xd);
        new_localvar(ls,pTVar10,2);
        new_localvar(ls,pTVar11,3);
        if ((ls->t).token == 0x2c) {
          iVar8 = 4;
          do {
            iVar7 = iVar8;
            luaX_next(ls);
            pTVar11 = str_checkname(ls);
            new_localvar(ls,pTVar11,iVar7);
            iVar8 = iVar7 + 1;
          } while ((ls->t).token == 0x2c);
          iVar7 = iVar7 + -2;
        }
        checknext(ls,0x10b);
        iVar8 = ls->linenumber;
        nexps = explist1(ls,(expdesc *)&local_70);
        adjust_assign((LexState *)ls->fs,3,nexps,(expdesc *)&local_70);
        luaK_checkstack(local_38,3);
        forbody(ls,iVar6,iVar8,iVar7,0);
      }
      else if (iVar6 == 0x3d) {
        pFVar16 = ls->fs;
        iVar6 = pFVar16->freereg;
        pTVar10 = luaX_newstring(ls,"(for index)",0xb);
        new_localvar(ls,pTVar10,0);
        pTVar10 = luaX_newstring(ls,"(for limit)",0xb);
        new_localvar(ls,pTVar10,1);
        pTVar10 = luaX_newstring(ls,"(for step)",10);
        new_localvar(ls,pTVar10,2);
        new_localvar(ls,pTVar11,3);
        checknext(ls,0x3d);
        subexpr(ls,(expdesc *)&local_70,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
        checknext(ls,0x2c);
        subexpr(ls,(expdesc *)&local_70,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
        if ((ls->t).token == 0x2c) {
          luaX_next(ls);
          subexpr(ls,(expdesc *)&local_70,0);
          luaK_exp2nextreg(ls->fs,(expdesc *)&local_70);
        }
        else {
          iVar7 = pFVar16->freereg;
          uVar13 = luaK_numberK(pFVar16,1.0);
          luaK_codeABx(pFVar16,OP_LOADK,iVar7,uVar13);
          luaK_reserveregs(pFVar16,1);
        }
        forbody(ls,iVar6,iVar15,1,1);
      }
      else {
        luaX_syntaxerror(ls,"\'=\' or \'in\' expected");
      }
      check_match(ls,0x106,0x108,iVar15);
      leaveblock(pFVar2);
      bVar5 = true;
      goto LAB_00110acf;
    case 0x109:
      luaX_next(ls);
      singlevar(ls,(expdesc *)&local_70);
      while (iVar6 = (ls->t).token, iVar6 == 0x2e) {
        field(ls,(expdesc *)&local_70);
      }
      if (iVar6 == 0x3a) {
        field(ls,(expdesc *)&local_70);
      }
      body(ls,(expdesc *)&local_50,(uint)(iVar6 == 0x3a),iVar15);
      luaK_storevar(ls->fs,(expdesc *)&local_70,(expdesc *)&local_50);
      luaK_fixline(ls->fs,iVar15);
      break;
    case 0x10a:
      pFVar2 = ls->fs;
      local_70.prev = (LHS_assign *)CONCAT44(local_70.prev._4_4_,0xffffffff);
      while( true ) {
        luaX_next(ls);
        iVar7 = cond(ls);
        checknext(ls,0x112);
        block(ls);
        iVar6 = (ls->t).token;
        if (iVar6 != 0x105) break;
        iVar6 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&local_70,iVar6);
        luaK_patchtohere(pFVar2,iVar7);
      }
      if (iVar6 == 0x104) {
        iVar6 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&local_70,iVar6);
        luaK_patchtohere(pFVar2,iVar7);
        luaX_next(ls);
        block(ls);
      }
      else {
        luaK_concat(pFVar2,(int *)&local_70,iVar7);
      }
      luaK_patchtohere(pFVar2,(int)local_70.prev);
      check_match(ls,0x106,0x10a,iVar15);
      goto LAB_001109fb;
    case 0x10c:
      luaX_next(ls);
      if ((ls->t).token == 0x109) {
        luaX_next(ls);
        pFVar2 = ls->fs;
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11,0);
        local_70.v.k = pFVar2->freereg;
        local_70.v.u.nval = -NAN;
        local_70.prev = (LHS_assign *)CONCAT44(local_70.prev._4_4_,6);
        luaK_reserveregs(pFVar2,1);
        pFVar16 = ls->fs;
        bVar12 = pFVar16->nactvar + 1;
        pFVar16->nactvar = bVar12;
        pFVar16->f->locvars[*(ushort *)&pFVar16->upvalues[(ulong)bVar12 + 0x3b].info].startpc =
             pFVar16->pc;
        body(ls,(expdesc *)&local_50,0,ls->linenumber);
        luaK_storevar(pFVar2,(expdesc *)&local_70,(expdesc *)&local_50);
        pFVar2->f->locvars[*(ushort *)&pFVar2->upvalues[(ulong)pFVar2->nactvar + 0x3b].info].startpc
             = pFVar2->pc;
      }
      else {
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11,0);
        iVar6 = (ls->t).token;
        uVar13 = 1;
        if (iVar6 == 0x2c) {
          uVar9 = 1;
          do {
            luaX_next(ls);
            pTVar11 = str_checkname(ls);
            uVar13 = uVar9 + 1;
            new_localvar(ls,pTVar11,uVar9);
            iVar6 = (ls->t).token;
            uVar9 = uVar13;
          } while (iVar6 == 0x2c);
        }
        if (iVar6 == 0x3d) {
          luaX_next(ls);
          iVar6 = explist1(ls,(expdesc *)&local_70);
        }
        else {
          local_70.prev = (LHS_assign *)((ulong)local_70.prev & 0xffffffff00000000);
          iVar6 = 0;
        }
        adjust_assign((LexState *)ls->fs,uVar13,iVar6,(expdesc *)&local_70);
        pFVar2 = ls->fs;
        bVar12 = pFVar2->nactvar + (char)uVar13;
        pFVar2->nactvar = bVar12;
        iVar6 = pFVar2->pc;
        pLVar4 = pFVar2->f->locvars;
        lVar14 = -(ulong)uVar13;
        do {
          pLVar4[pFVar2->actvar[(ulong)bVar12 + lVar14]].startpc = iVar6;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0);
      }
      break;
    case 0x110:
      pFVar2 = ls->fs;
      iVar6 = luaK_getlabel(pFVar2);
      local_70.v.k = ~VVOID;
      local_70.v._6_1_ = 1;
      local_70.v._4_1_ = pFVar2->nactvar;
      local_70.v._5_1_ = 0;
      local_70.prev = (LHS_assign *)pFVar2->bl;
      local_48[0].s.info = -1;
      local_48[0]._5_1_ = '\0';
      local_48[0]._6_1_ = '\0';
      pFVar2->bl = (BlockCnt *)&local_50;
      local_50 = &local_70;
      local_48[0]._4_1_ = local_70.v._4_1_;
      luaX_next(ls);
      chunk(ls);
      check_match(ls,0x114,0x110,iVar15);
      iVar15 = cond(ls);
      if (local_48[0].s.aux._1_1_ == '\0') {
        leaveblock(pFVar2);
        pFVar16 = ls->fs;
      }
      else {
        breakstat(ls);
        luaK_patchtohere(ls->fs,iVar15);
        leaveblock(pFVar2);
        pFVar16 = ls->fs;
        iVar15 = luaK_jump(pFVar2);
      }
      luaK_patchlist(pFVar16,iVar15,iVar6);
      leaveblock(pFVar2);
LAB_001109fb:
      bVar5 = true;
      goto LAB_00110acf;
    case 0x111:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar6 = (ls->t).token;
      uVar9 = 0;
      uVar13 = iVar6 - 0x104;
      if ((uVar13 < 0x1c) && ((0x8010007U >> (uVar13 & 0x1f) & 1) != 0)) {
        iVar15 = 0;
      }
      else {
        iVar15 = 0;
        if (iVar6 != 0x3b) {
          iVar15 = explist1(ls,(expdesc *)&local_70);
          if ((int)local_70.prev - 0xdU < 2) {
            luaK_setreturns(pFVar2,(expdesc *)&local_70,-1);
            if ((iVar15 == 1) && ((int)local_70.prev == 0xd)) {
              pIVar3 = pFVar2->f->code;
              pIVar3[(int)local_70.v.k] = pIVar3[(int)local_70.v.k] & 0xffffffc0 | 0x1d;
            }
            uVar9 = (uint)pFVar2->nactvar;
            iVar15 = -1;
          }
          else if (iVar15 == 1) {
            uVar9 = luaK_exp2anyreg(pFVar2,(expdesc *)&local_70);
            iVar15 = 1;
          }
          else {
            luaK_exp2nextreg(pFVar2,(expdesc *)&local_70);
            uVar9 = (uint)pFVar2->nactvar;
          }
        }
      }
      luaK_ret(pFVar2,uVar9,iVar15);
LAB_001105e9:
      bVar5 = false;
      goto LAB_00110acf;
    case 0x115:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar6 = luaK_getlabel(pFVar2);
      iVar7 = cond(ls);
      local_70.v.k = ~VVOID;
      local_70.v._6_1_ = 1;
      local_70.v._4_1_ = pFVar2->nactvar;
      local_70.v._5_1_ = 0;
      local_70.prev = (LHS_assign *)pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_70;
      checknext(ls,0x103);
      block(ls);
      iVar8 = luaK_jump(pFVar2);
      luaK_patchlist(pFVar2,iVar8,iVar6);
      check_match(ls,0x106,0x115,iVar15);
      leaveblock(pFVar2);
      luaK_patchtohere(pFVar2,iVar7);
    }
LAB_00110acc:
    bVar5 = true;
LAB_00110acf:
    if ((ls->t).token == 0x3b) {
      luaX_next(ls);
    }
    ls->fs->freereg = (uint)ls->fs->nactvar;
  } while (bVar5);
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

static void chunk (LexState *ls) {
  /* chunk -> { stat [`;'] } */
  int islast = 0;
  enterlevel(ls);
  while (!islast && !block_follow(ls->t.token)) {
    islast = statement(ls);
    testnext(ls, ';');
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  }
  leavelevel(ls);
}